

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CallOnce.h
# Opt level: O0

void axl::sl::
     callOnce<axl::sl::ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::PackPtrSize>>,unsigned_char*>
               (undefined8 param_1,int32_t *param_2)

{
  int32_t iVar1;
  int32_t value;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int32_t *local_18;
  
  local_18 = param_2;
  if (param_2 == (int32_t *)0x0) {
    local_18 = &callOnce<axl::sl::ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::PackPtrSize>_>,_unsigned_char_*>
                ::defaultFlag;
  }
  iVar2 = *local_18;
  if (iVar2 != 2) {
    if ((iVar2 == 0) && (iVar1 = sys::atomicCmpXchg(local_18,0,1), iVar1 == 0)) {
      ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::PackPtrSize>_>::operator()
                ((ConstructSimpleSingleton<axl::sl::PackerImpl<axl::sl::PackPtrSize>_> *)
                 CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      sys::atomicXchg(local_18,2);
    }
    else {
      do {
        sys::yieldProcessor();
      } while (*local_18 != 2);
    }
  }
  return;
}

Assistant:

void
callOnce(
	Functor functor,
	Argument argument,
	volatile int32_t* flag = NULL
) {
	enum OnceFlag {
		OnceFlag_Uninitialized = 0,
		OnceFlag_Initializing  = 1,
		OnceFlag_Initialized   = 2,
	};

	static volatile int32_t defaultFlag = 0;
	if (!flag)
		flag = &defaultFlag;

	int32_t value = *flag;
	if (value == OnceFlag_Initialized)
		return;

	if (value == OnceFlag_Uninitialized && // try to save one interlocked cmpxcg
		sys::atomicCmpXchg(flag, OnceFlag_Uninitialized, OnceFlag_Initializing) == OnceFlag_Uninitialized) {
		functor(argument);
		sys::atomicXchg(flag, OnceFlag_Initialized);
	} else do {
		sys::yieldProcessor();
	} while (*flag != OnceFlag_Initialized);
}